

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O2

uint8_t MatchSorted(Size size)

{
  long lVar1;
  byte bVar2;
  uint8_t uVar3;
  
  if (0x217 < size) {
    lVar1 = 0x3f;
    if (size != 0) {
      for (; size >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    bVar2 = (byte)lVar1 ^ 0x3f;
    uVar3 = '?';
    if (size < 0x2000000) {
      uVar3 = ((byte)(size >> (0x3d - bVar2 & 0x3f)) & 3) + bVar2 * -4 + 0xd8;
    }
    return uVar3;
  }
  __assert_fail("size >= NOT_EXACT_MIN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,199,"uint8_t MatchSorted(Size)");
}

Assistant:

static uint8_t MatchSorted(Size size) {
    assert(size >= NOT_EXACT_MIN);
#ifndef __GNUC__
#error "GCC builtin is used."
#endif
    unsigned mostSigBitIndex =
            (unsigned) sizeof(Size) * 8 - __builtin_clzl(size) - 1;
    assert(mostSigBitIndex >= 9);
    if (((mostSigBitIndex - 9) << 2u) >= 64) {
        return 63;
    }
    return ((mostSigBitIndex - 9) << 2u) |
           ((size >> (mostSigBitIndex - 2u)) & 0x03u);
}